

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-dump-file.cpp
# Opt level: O3

void corrupt(FILE *stream)

{
  int iVar1;
  ulong in_RAX;
  size_t sVar2;
  char *__s;
  long lVar3;
  uint8_t v;
  undefined8 uStack_28;
  
  lVar3 = 8;
  uStack_28 = in_RAX;
  do {
    sVar2 = fread((void *)((long)&uStack_28 + 7),1,1,(FILE *)stream);
    if (sVar2 != 1) {
      iVar1 = ferror((FILE *)stream);
      if (iVar1 == 0) {
        return;
      }
      __s = "get an error...";
      goto LAB_001091f4;
    }
    if (lVar3 != 8) {
      putchar(0x20);
    }
    printf("%02hhx",uStack_28 >> 0x38);
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  sVar2 = fread((void *)((long)&uStack_28 + 7),1,1,(FILE *)stream);
  if (sVar2 == 1) {
    __s = "...";
  }
  else {
    iVar1 = ferror((FILE *)stream);
    if (iVar1 == 0) {
      return;
    }
    __s = "\nget an error...";
  }
LAB_001091f4:
  puts(__s);
  return;
}

Assistant:

void corrupt(FILE* stream)
{
	uint8_t v;
	for (size_t i = 0; i < 8; i++)
	{
		if (fread(&v, 1, 1, stream) != 1)
		{
			if (ferror(stream))
			{
				printf("get an error...\n");
			}
			return;
		}
		if (i != 0)
		{
			printf(" ");
		}
		printf("%02hhx", v);
	}
	if (fread(&v, 1, 1, stream) != 1)
	{
		if (ferror(stream))
		{
			printf("\nget an error...\n");
		}
		return;
	}
	printf("...\n");
}